

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_print_exception_op(sexp ctx,sexp self,sexp_sint_t n,sexp exn,sexp out)

{
  int *piVar1;
  char *pcVar2;
  uint uVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_R8;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp tmp;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp ls;
  sexp in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  sexp ctx_00;
  sexp ctx_01;
  sexp local_50;
  undefined1 local_48 [16];
  undefined8 uVar4;
  undefined8 local_8;
  
  uVar4 = &DAT_0000043e;
  memset(local_48,0,0x10);
  local_50 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffffa0,0,0x10);
  if ((((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0x13)) &&
     ((((((sexp)in_RCX)->value).type.name == *(sexp *)(*(long *)(in_RDI + 0x28) + 0xe0) &&
       ((((((sexp)in_RCX)->value).string.length & 3) == 0 &&
        (((((sexp)in_RCX)->value).type.slots)->tag == 0x13)))) ||
      ((((sexp)in_RCX)->value).type.name == (sexp)0xa3e)))) {
    local_8 = sexp_print_exception_op((sexp)in_RSI,(sexp)in_RDX,in_RCX,(sexp)in_R8,(sexp)uVar4);
  }
  else {
    local_48._0_8_ = &stack0xffffffffffffffc8;
    local_48._8_8_ = *(undefined8 *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = local_48;
    ctx_00 = (sexp)&local_50;
    ctx_01 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffffa0;
    if (((in_R8 & 3) != 0) || (((sexp)in_R8)->tag != 0x11)) {
      local_50 = sexp_make_output_port
                           ((sexp)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            (FILE *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
      in_R8 = local_50;
    }
    if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
      fputs("ERROR",(FILE *)((FILE *)in_R8)->_IO_write_base);
    }
    else {
      sexp_buffered_write_string
                (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                 (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    }
    if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0x13)) {
      if ((((sexp)in_RCX)->value).type.getters != (sexp)0x0) {
        if ((((((sexp)in_RCX)->value).bytecode.length & 3) == 0) &&
           (((((sexp)in_RCX)->value).type.getters)->tag == 0x14)) {
          piVar1 = *(int **)(((((sexp)in_RCX)->value).port.stream)->_IO_read_ptr + 8);
          if ((piVar1 != (int *)0x0) &&
             ((((ulong)piVar1 & 0xf) == 6 || ((((ulong)piVar1 & 3) == 0 && (*piVar1 == 7)))))) {
            if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
              fputs(" in ",(FILE *)((FILE *)in_R8)->_IO_write_base);
            }
            else {
              sexp_buffered_write_string
                        (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98
                                                ),
                         (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
            }
            sexp_write_op(ctx_01,ctx_00,
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                          in_stack_ffffffffffffff88);
          }
        }
        else if ((((((sexp)in_RCX)->value).bytecode.length & 3) == 0) &&
                (((((sexp)in_RCX)->value).type.getters)->tag == 0x1b)) {
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            fputs(" in ",(FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
          sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
        }
      }
      uVar4 = (((sexp)in_RCX)->value).type.setters;
      if (((((sexp)uVar4 == (sexp)0x0) || ((uVar4 & 3) != 0)) || (((sexp)uVar4)->tag != 6)) &&
         ((((((sexp)in_RCX)->value).type.getters != (sexp)0x0 &&
           (((((sexp)in_RCX)->value).bytecode.length & 3) == 0)) &&
          (((((sexp)in_RCX)->value).type.getters)->tag == 0x14)))) {
        uVar4 = *(undefined8 *)(((((sexp)in_RCX)->value).port.stream)->_IO_read_ptr + 0x18);
      }
      if ((((sexp)uVar4 != (sexp)0x0) && ((uVar4 & 3) == 0)) && (((sexp)uVar4)->tag == 6)) {
        if ((((((sexp)uVar4)->value).string.offset & 1) == 1) &&
           ((((sexp)uVar4)->value).type.cpl != (sexp)0x0)) {
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            fputs(" on line ",(FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
          sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
        }
        if ((((((sexp)uVar4)->value).stack.length & 3) == 0) &&
           (((((sexp)uVar4)->value).type.name)->tag == 9)) {
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            fputs(" of file ",(FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            fputs((((((((sexp)uVar4)->value).type.name)->value).type.name)->value).flonum_bits + 8 +
                  (long)(((((sexp)uVar4)->value).type.name)->value).type.cpl,
                  (FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
        }
      }
      if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
        fputs(": ",(FILE *)((FILE *)in_R8)->_IO_write_base);
      }
      else {
        sexp_buffered_write_string
                  (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      if ((((((sexp)in_RCX)->value).string.offset & 3) == 0) &&
         (((((sexp)in_RCX)->value).type.cpl)->tag == 9)) {
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          fputs((((((((sexp)in_RCX)->value).type.cpl)->value).type.name)->value).flonum_bits + 8 +
                (long)(((((sexp)in_RCX)->value).type.cpl)->value).type.cpl,
                (FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else {
          sexp_buffered_write_string
                    (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
      else {
        sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
      }
      if ((((((sexp)in_RCX)->value).type.slots == (sexp)0x0) ||
          (((((sexp)in_RCX)->value).string.length & 3) != 0)) ||
         (((((sexp)in_RCX)->value).type.slots)->tag != 6)) {
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          putc(10,(FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else if (((FILE *)in_R8)->_IO_buf_base < ((FILE *)in_R8)->_IO_backup_base) {
          pcVar2 = ((FILE *)in_R8)->_IO_buf_base;
          ((FILE *)in_R8)->_IO_buf_base = pcVar2 + 1;
          ((FILE *)in_R8)->_IO_write_ptr[(long)pcVar2] = '\n';
        }
        else {
          sexp_buffered_write_char
                    ((sexp)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
        }
      }
      else if ((((((sexp)in_RCX)->value).type.slots)->value).type.cpl == (sexp)0x23e) {
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          fputs(": ",(FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else {
          sexp_buffered_write_string
                    (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          fputs("\n",(FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else {
          sexp_buffered_write_string
                    (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
      else {
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          fputs("\n",(FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else {
          sexp_buffered_write_string
                    (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
        uVar4 = (((sexp)in_RCX)->value).type.slots;
        while( true ) {
          uVar3 = in_stack_ffffffffffffff9c & 0xffffff;
          if ((uVar4 & 3) == 0) {
            uVar3 = CONCAT13(((sexp)uVar4)->tag == 6,(int3)in_stack_ffffffffffffff9c);
          }
          in_stack_ffffffffffffff9c = uVar3;
          if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') break;
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            fputs("    ",(FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else {
            sexp_buffered_write_string
                      (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
          }
          sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                        (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                        in_stack_ffffffffffffff88);
          if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
            putc(10,(FILE *)((FILE *)in_R8)->_IO_write_base);
          }
          else if (((FILE *)in_R8)->_IO_buf_base < ((FILE *)in_R8)->_IO_backup_base) {
            pcVar2 = ((FILE *)in_R8)->_IO_buf_base;
            ((FILE *)in_R8)->_IO_buf_base = pcVar2 + 1;
            ((FILE *)in_R8)->_IO_write_ptr[(long)pcVar2] = '\n';
            in_stack_ffffffffffffff98 = 0;
          }
          else {
            in_stack_ffffffffffffff98 =
                 sexp_buffered_write_char
                           ((sexp)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                            in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
          }
          uVar4 = (((sexp)uVar4)->value).type.cpl;
        }
      }
    }
    else {
      if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
        fputs(": ",(FILE *)((FILE *)in_R8)->_IO_write_base);
      }
      else {
        sexp_buffered_write_string
                  (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 9)) {
        if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
          fputs((((((sexp)in_RCX)->value).type.name)->value).flonum_bits + 8 +
                (long)(((sexp)in_RCX)->value).type.cpl,(FILE *)((FILE *)in_R8)->_IO_write_base);
        }
        else {
          sexp_buffered_write_string
                    (ctx_00,(char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        }
      }
      else {
        sexp_write_op(ctx_01,ctx_00,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      (sexp)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
      }
      if (((FILE *)in_R8)->_IO_write_ptr == (char *)0x0) {
        putc(10,(FILE *)((FILE *)in_R8)->_IO_write_base);
      }
      else if (((FILE *)in_R8)->_IO_buf_base < ((FILE *)in_R8)->_IO_backup_base) {
        pcVar2 = ((FILE *)in_R8)->_IO_buf_base;
        ((FILE *)in_R8)->_IO_buf_base = pcVar2 + 1;
        ((FILE *)in_R8)->_IO_write_ptr[(long)pcVar2] = '\n';
      }
      else {
        sexp_buffered_write_char
                  ((sexp)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   in_stack_ffffffffffffff94,in_stack_ffffffffffffff88);
      }
    }
    *(undefined8 *)(in_RDI + 0x6080) = local_48._8_8_;
    local_8 = &DAT_0000043e;
  }
  return (sexp)local_8;
}

Assistant:

sexp sexp_print_exception_op (sexp ctx, sexp self, sexp_sint_t n, sexp exn, sexp out) {
  sexp_gc_var2(ls, tmp);
  /* unwrap continuable exceptions */
  if (sexp_exceptionp(exn)
      && ((sexp_exception_kind(exn) == sexp_global(ctx, SEXP_G_CONTINUABLE_SYMBOL)
           && sexp_exceptionp(sexp_exception_irritants(exn)))
          || sexp_exception_kind(exn) == SEXP_UNCAUGHT)) {
    return sexp_print_exception_op(ctx, self, n, sexp_exception_irritants(exn), out);
  }
  sexp_gc_preserve2(ctx, ls, tmp);
  if (! sexp_oportp(out))
    out = tmp = sexp_make_output_port(ctx, stderr, SEXP_FALSE);
  sexp_write_string(ctx, "ERROR", out);
  if (sexp_exceptionp(exn)) {
    if (sexp_exception_procedure(exn)) {
      if (sexp_procedurep(sexp_exception_procedure(exn))) {
        ls = sexp_bytecode_name(
              sexp_procedure_code(sexp_exception_procedure(exn)));
        if (ls && sexp_symbolp(ls)) {
          sexp_write_string(ctx, " in ", out);
          sexp_write(ctx, ls, out);
        }
      } else if (sexp_opcodep(sexp_exception_procedure(exn))) {
        sexp_write_string(ctx, " in ", out);
        sexp_write(ctx, sexp_opcode_name(sexp_exception_procedure(exn)), out);
      }
    }
    ls = sexp_exception_source(exn);
    if ((! (ls && sexp_pairp(ls)))
        && sexp_exception_procedure(exn)
        && sexp_procedurep(sexp_exception_procedure(exn)))
      ls = sexp_bytecode_source(sexp_procedure_code(sexp_exception_procedure(exn)));
    if (ls && sexp_pairp(ls)) {
      if (sexp_fixnump(sexp_cdr(ls)) && (sexp_cdr(ls) >= SEXP_ZERO)) {
        sexp_write_string(ctx, " on line ", out);
        sexp_write(ctx, sexp_cdr(ls), out);
      }
      if (sexp_stringp(sexp_car(ls))) {
        sexp_write_string(ctx, " of file ", out);
        sexp_write_string(ctx, sexp_string_data(sexp_car(ls)), out);
      }
    }
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(sexp_exception_message(exn)))
      sexp_write_string(ctx, sexp_string_data(sexp_exception_message(exn)), out);
    else
      sexp_write(ctx, sexp_exception_message(exn), out);
    if (sexp_exception_irritants(exn)
        && sexp_pairp(sexp_exception_irritants(exn))) {
      if (sexp_nullp(sexp_cdr(sexp_exception_irritants(exn)))) {
        sexp_write_string(ctx, ": ", out);
        sexp_write(ctx, sexp_car(sexp_exception_irritants(exn)), out);
        sexp_write_string(ctx, "\n", out);
      } else {
        sexp_write_string(ctx, "\n", out);
        for (ls=sexp_exception_irritants(exn);
             sexp_pairp(ls); ls=sexp_cdr(ls)) {
          sexp_write_string(ctx, "    ", out);
          sexp_write(ctx, sexp_car(ls), out);
          sexp_write_char(ctx, '\n', out);
        }
      }
    } else {
      sexp_write_char(ctx, '\n', out);
    }
  } else {
    sexp_write_string(ctx, ": ", out);
    if (sexp_stringp(exn))
      sexp_write_string(ctx, sexp_string_data(exn), out);
    else
      sexp_write(ctx, exn, out);
    sexp_write_char(ctx, '\n', out);
  }
  sexp_gc_release2(ctx);
  return SEXP_VOID;
}